

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O1

void __thiscall QGraphicsScene::~QGraphicsScene(QGraphicsScene *this)

{
  long lVar1;
  QArrayData *pQVar2;
  long lVar3;
  long lVar4;
  long in_FS_OFFSET;
  QGraphicsScene *local_40;
  anon_class_8_1_54a39814_for__M_pred local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined ***)this = &PTR_metaObject_00821670;
  lVar1 = *(long *)(this + 8);
  if ((char)QCoreApplicationPrivate::is_app_closing == '\0') {
    local_38.t = (QWindow **)&local_40;
    local_40 = this;
    QtPrivate::
    sequential_erase_if<QList<QGraphicsScene*>,QtPrivate::sequential_erase<QList<QGraphicsScene*>,QGraphicsScene*>(QList<QGraphicsScene*>&,QGraphicsScene*const&)::_lambda(auto:1_const&)_1_>
              ((QList<QGraphicsScene_*> *)(*(long *)(QCoreApplication::self + 8) + 0x178),&local_38)
    ;
  }
  clear(this);
  pQVar2 = *(QArrayData **)(lVar1 + 0x280);
  lVar3 = *(long *)(lVar1 + 0x288);
  lVar1 = *(long *)(lVar1 + 0x290);
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (lVar1 != 0) {
    lVar4 = 0;
    do {
      QGraphicsView::setScene(*(QGraphicsView **)(lVar3 + lVar4),(QGraphicsScene *)0x0);
      lVar4 = lVar4 + 8;
    } while (lVar1 << 3 != lVar4);
  }
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar2,8,0x10);
    }
  }
  QObject::~QObject((QObject *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QGraphicsScene::~QGraphicsScene()
{
    Q_D(QGraphicsScene);

    // Remove this scene from qApp's global scene list.
    if (!QApplicationPrivate::is_app_closing)
        qApp->d_func()->scene_list.removeAll(this);

    clear();

    // Remove this scene from all associated views.
    // Note: d->views is modified by QGraphicsView::setScene, so must make a copy
    const auto views = d->views;
    for (auto view : std::as_const(views))
        view->setScene(nullptr);
}